

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp4::groebnerRow16_0000_f
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double factor;
  Index in_stack_ffffffffffffff58;
  DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *in_stack_ffffffffffffff60;
  DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x9266e0);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x926701);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92672e);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92675c);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x926780);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *pSVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar12,auVar20);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9267d6);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9267fa);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *pSVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar13,auVar21);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x926850);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x926874);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *pSVar2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar14,auVar22);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9268ca);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9268ee);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *pSVar2;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar15,auVar23);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x926944);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x926968);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *pSVar2;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar16,auVar24);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9269be);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x9269e2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SVar1;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *pSVar2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar9,auVar17,auVar25);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x926a38);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x926a5c);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SVar1;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *pSVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar10,auVar18,auVar26);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x926ab5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x926adc);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SVar1;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *pSVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar11,auVar19,auVar27);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::groebnerRow16_0000_f( Eigen::Matrix<double,25,37> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,28) / groebnerMatrix(16,28);
  groebnerMatrix(targetRow,28) = 0.0;
  groebnerMatrix(targetRow,29) -= factor * groebnerMatrix(16,29);
  groebnerMatrix(targetRow,30) -= factor * groebnerMatrix(16,30);
  groebnerMatrix(targetRow,31) -= factor * groebnerMatrix(16,31);
  groebnerMatrix(targetRow,32) -= factor * groebnerMatrix(16,32);
  groebnerMatrix(targetRow,33) -= factor * groebnerMatrix(16,33);
  groebnerMatrix(targetRow,34) -= factor * groebnerMatrix(16,34);
  groebnerMatrix(targetRow,35) -= factor * groebnerMatrix(16,35);
  groebnerMatrix(targetRow,36) -= factor * groebnerMatrix(16,36);
}